

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

QStringList * __thiscall
Parser::findEnumValues
          (QStringList *__return_storage_ptr__,Parser *this,QString *name,QStringList *includes)

{
  Data *pDVar1;
  char16_t *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  iterator iVar9;
  QString *pQVar10;
  char *pcVar11;
  qsizetype qVar12;
  long lVar13;
  pointer pQVar14;
  undefined1 *puVar15;
  int __oflag;
  QString *name_00;
  long lVar16;
  QString *e;
  QString *str;
  long in_FS_OFFSET;
  qsizetype local_180;
  QRegularExpressionMatchIterator m;
  QRegularExpression macro;
  QRegularExpressionMatch match_1;
  QRegularExpressionMatchIterator m_1;
  QRegularExpressionMatch match;
  QTextStream stream;
  QArrayDataPointer<char16_t> local_e8;
  QIODevice local_c8;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<QString> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)0x0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_78.ptr = L"::";
  local_58.size = 0;
  local_78.size = 2;
  QString::split((QStringList *)&local_98,name,(QString *)&local_78,(SplitBehavior)0x0,CaseSensitive
                );
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  iVar9 = QList<QString>::end((QList<QString> *)&local_98);
  local_b0.d = iVar9.i[-1].d.d;
  local_b0.ptr = iVar9.i[-1].d.ptr;
  local_b0.size = iVar9.i[-1].d.size;
  if (local_b0.d != (Data *)0x0) {
    LOCK();
    ((local_b0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  name_00 = (includes->d).ptr;
  pQVar10 = name_00 + (includes->d).size;
  bVar6 = false;
  do {
    if (name_00 == pQVar10) goto LAB_001079a8;
    local_c8._vptr_QIODevice = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.d_ptr._M_t.
    super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
    super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
    super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
         (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>)
         &DAT_aaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)&local_c8,name_00);
    iVar7 = QFile::open((QFile *)&local_c8,(char *)0x11,__oflag);
    if ((char)iVar7 == '\0') {
      bVar6 = true;
      bVar3 = false;
    }
    else {
      local_e8.d = (Data *)0x0;
      local_e8.ptr = (char16_t *)0x0;
      local_e8.size = 0;
      stream.d_ptr._M_t.
      super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
      super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
      super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl =
           (unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>)
           &DAT_aaaaaaaaaaaaaaaa;
      QTextStream::QTextStream(&stream,&local_c8);
      while (bVar3 = QTextStream::atEnd(&stream), !bVar3) {
        local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QTextStream::readLine((QString *)&local_58,&stream,0);
        QString::trimmed_helper((QString *)&local_78,(QString *)&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        local_58.ptr = (char16_t *)CONCAT71(local_58.ptr._1_7_,10);
        local_58.d = (Data *)&local_78;
        operator+=((QString *)&local_e8,(QStringBuilder<QString_&,_QLatin1Char> *)&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      }
      pcVar11 = (char *)0x0;
      while( true ) {
        local_58.size = 0;
        local_58.ptr = (char16_t *)0x0;
        local_58.d = (Data *)0x0;
        local_78.size = 2;
        local_78.ptr = L"//";
        local_78.d = (Data *)0x0;
        pcVar11 = (char *)QString::indexOf((QString *)&local_e8,(QString *)&local_78,
                                           (qsizetype)pcVar11,CaseSensitive);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        if ((long)pcVar11 < 0) break;
        QString::indexOf((QString *)&local_e8,(QChar)0xa,(qsizetype)pcVar11,CaseSensitive);
        QString::remove((QString *)&local_e8,pcVar11);
      }
      local_58.d = (Data *)0x0;
      local_58.ptr = (char16_t *)0x0;
      local_78.d = (Data *)0x0;
      local_78.ptr = L"/*";
      local_58.size = 0;
      local_78.size = 2;
      pcVar11 = (char *)QString::indexOf((QString *)&local_e8,(QString *)&local_78,0,CaseSensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      while (QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58), -1 < (long)pcVar11) {
        local_58.d = (Data *)0x0;
        local_58.ptr = (char16_t *)0x0;
        local_78.d = (Data *)0x0;
        local_78.ptr = L"*/";
        local_58.size = 0;
        local_78.size = 2;
        qVar12 = QString::indexOf((QString *)&local_e8,(QString *)&local_78,(qsizetype)pcVar11,
                                  CaseSensitive);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        if (qVar12 == -1) break;
        QString::remove((QString *)&local_e8,pcVar11);
        local_58.d = (Data *)0x0;
        local_58.ptr = (char16_t *)0x0;
        local_78.d = (Data *)0x0;
        local_78.ptr = L"/*";
        local_58.size = 0;
        local_78.size = 2;
        pcVar11 = (char *)QString::indexOf((QString *)&local_e8,(QString *)&local_78,
                                           (qsizetype)pcVar11,CaseSensitive);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      }
      local_78.d = (Data *)0x0;
      local_58.d = (Data *)0x0;
      while (bVar3 = findSpaceRange((QString *)&local_e8,(qsizetype *)&local_78,
                                    (qsizetype *)&local_58), bVar3) {
        QString::remove((QString *)&local_e8,(char *)local_78.d);
      }
      local_180 = 0;
      lVar16 = 0;
      do {
        lVar13 = lVar16;
        puVar15 = (undefined1 *)(local_98.size + -1);
        if ((long)puVar15 <= lVar13) goto LAB_001076a6;
        macro.d.d.ptr =
             (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d = (Data *)0x0;
        local_58.ptr = (char16_t *)0x0;
        local_78.d = (Data *)0x0;
        local_78.ptr = L"(struct|class|namespace) +([A-Za-z0-9_]*)? +([A-Za-z0-9]*;?)";
        local_58.size = 0;
        local_78.size = 0x3c;
        bVar3 = false;
        QRegularExpression::QRegularExpression(&macro,(QString *)&local_78,(PatternOptions)0x0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        m.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
                    &DAT_aaaaaaaaaaaaaaaa;
        QRegularExpression::globalMatch
                  ((QRegularExpression *)&m,(QString *)&macro,(qsizetype)&local_e8,NormalMatch,
                   (MatchOptions)0x0);
        do {
          bVar4 = QRegularExpressionMatchIterator::hasNext(&m);
          if ((!bVar4) || (bVar3)) break;
          match.d.d.ptr =
               (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa;
          QRegularExpressionMatchIterator::next((QRegularExpressionMatchIterator *)&match);
          local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QRegularExpressionMatch::captured((QString *)&local_78,&match,2);
          bVar4 = QString::endsWith((QString *)&local_78,(QChar)0x3b,CaseSensitive);
          if (bVar4) {
LAB_00107548:
            bVar5 = QRegularExpressionMatch::hasCaptured(&match,3);
            bVar4 = true;
            if (bVar5) {
              QRegularExpressionMatch::captured((QString *)&local_58,&match,3);
              qVar12 = local_78.size;
              pcVar2 = local_78.ptr;
              pDVar1 = local_78.d;
              local_78.d = local_58.d;
              local_78.ptr = local_58.ptr;
              local_58.d = pDVar1;
              local_58.ptr = pcVar2;
              local_78.size = local_58.size;
              local_58.size = qVar12;
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
              bVar5 = QString::endsWith((QString *)&local_78,(QChar)0x3b,CaseSensitive);
              if (!bVar5) {
                pQVar14 = QList<QString>::data((QList<QString> *)&local_98);
                bVar5 = comparesEqual((QString *)&local_78,pQVar14 + lVar13);
                if (bVar5) {
                  iVar7 = 3;
                  qVar12 = QRegularExpressionMatch::capturedStart(&match,3);
                  if ((int)local_180 < qVar12) goto LAB_00107615;
                }
              }
            }
          }
          else {
            pQVar14 = QList<QString>::data((QList<QString> *)&local_98);
            bVar4 = comparesEqual((QString *)&local_78,pQVar14 + lVar13);
            if (!bVar4) goto LAB_00107548;
            iVar7 = 2;
            qVar12 = QRegularExpressionMatch::capturedStart(&match,2);
            if (qVar12 <= (int)local_180) goto LAB_00107548;
LAB_00107615:
            local_180 = QRegularExpressionMatch::capturedStart(&match,iVar7);
            bVar3 = true;
            bVar4 = false;
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
          QRegularExpressionMatch::~QRegularExpressionMatch(&match);
        } while (bVar4);
        QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator(&m);
        QRegularExpression::~QRegularExpression(&macro);
        lVar16 = lVar13 + 1;
      } while (bVar3);
      if ((long)puVar15 <= lVar13) {
LAB_001076a6:
        match.d.d.ptr =
             (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d = (Data *)0x0;
        local_58.ptr = (char16_t *)0x0;
        local_78.d = (Data *)0x0;
        local_78.ptr = L"enum +([A-Za-z0-9_]*)";
        local_58.size = 0;
        local_78.size = 0x15;
        QRegularExpression::QRegularExpression
                  ((QRegularExpression *)&match,(QString *)&local_78,(PatternOptions)0x0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        m_1.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
                      &DAT_aaaaaaaaaaaaaaaa;
        QRegularExpression::globalMatch
                  ((QRegularExpression *)&m_1,(QString *)&match,(qsizetype)&local_e8,NormalMatch,
                   (MatchOptions)0x0);
LAB_0010773b:
        bVar3 = QRegularExpressionMatchIterator::hasNext(&m_1);
        if (bVar3) {
          match_1.d.d.ptr =
               (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa;
          QRegularExpressionMatchIterator::next((QRegularExpressionMatchIterator *)&match_1);
          qVar12 = QRegularExpressionMatch::capturedStart(&match_1,0);
          if (qVar12 < (int)local_180) goto code_r0x0010777d;
          local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QRegularExpressionMatch::captured((QString *)&local_78,&match_1,1);
          bVar4 = comparesEqual((QString *)&local_78,(QString *)&local_b0);
          if (!bVar4) {
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
            QRegularExpressionMatch::~QRegularExpressionMatch(&match_1);
            goto LAB_0010773b;
          }
          qVar12 = QRegularExpressionMatch::capturedEnd(&match_1,0);
          qVar12 = QString::indexOf((QString *)&local_e8,(QChar)0x7b,qVar12,CaseSensitive);
          uVar8 = (uint)qVar12;
          qVar12 = QString::indexOf((QString *)&local_e8,(QChar)0x7d,(long)(int)uVar8,CaseSensitive)
          ;
          local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QString::mid((QString *)&local_58,(QString *)&local_e8,(long)(int)(uVar8 + 1),
                       (long)(int)((int)qVar12 + ~uVar8));
          macro.d.d.ptr =
               (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)&DAT_aaaaaaaaaaaaaaaa;
          QString::split((QStringList *)&macro,(QString *)&local_58,(QChar)0xa,(SplitBehavior)0x0,
                         CaseSensitive);
          str = (QString *)&DAT_aaaaaaaaaaaaaaaa;
          for (lVar16 = -0x10; lVar16 != 0; lVar16 = lVar16 + -0x18) {
            m.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
                        &DAT_aaaaaaaaaaaaaaaa;
            QString::trimmed_helper((QString *)&m,str);
            bVar6 = QString::startsWith((QString *)&m,(QChar)0x23,CaseSensitive);
            if (!bVar6) {
              QList<QString>::emplaceBack<QString_const&>(__return_storage_ptr__,(QString *)&m);
            }
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&m);
            str = str + 1;
          }
          QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&macro);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
          QRegularExpressionMatch::~QRegularExpressionMatch(&match_1);
          bVar6 = true;
        }
        bVar3 = !bVar3;
        QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator(&m_1);
        QRegularExpression::~QRegularExpression((QRegularExpression *)&match);
        goto LAB_00107968;
      }
      bVar3 = true;
LAB_00107968:
      QTextStream::~QTextStream(&stream);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
    }
    QFile::~QFile((QFile *)&local_c8);
    name_00 = name_00 + 1;
  } while (bVar3);
  if (!bVar6) {
    QArrayDataPointer<QString>::~QArrayDataPointer(&__return_storage_ptr__->d);
  }
LAB_001079a8:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
code_r0x0010777d:
  QRegularExpressionMatch::~QRegularExpressionMatch(&match_1);
  goto LAB_0010773b;
}

Assistant:

QStringList Parser::findEnumValues(const QString &name, const QStringList &includes)
{
    QStringList split = name.split(QStringLiteral("::"));
    QString enumName = split.last();
    DEBUGPRINTF(printf("searching for %s\n", qPrintable(name)));
    QStringList ret;
    for (const QString &filename : includes) {
        QFile input(filename);
        if (!input.open(QIODevice::ReadOnly | QIODevice::Text)) {
            DEBUGPRINTF(printf("Cannot open '%s' for reading: %s\n",
                                qPrintable(filename), qPrintable(input.errorString())));
            return ret;
        }
        QString data;
        QTextStream stream(&input);
        while (!stream.atEnd()) {
            QString line = stream.readLine().trimmed();
            data += line + QLatin1Char('\n');
        }
        simplifyData(data);

        int pos = 0;
        bool valid = true;
        for (int i = 0; i < split.size() - 1; i++) {
            QRegularExpression macro(QStringLiteral("(struct|class|namespace) +([A-Za-z0-9_]*)? +([A-Za-z0-9]*;?)"));
            QRegularExpressionMatchIterator m = macro.globalMatch(data);
            bool found = false;
            while (m.hasNext() && !found) {
                QRegularExpressionMatch match = m.next();
                QString n = match.captured(2);
                if (!n.endsWith(QLatin1Char(';')) && n == split[i] && match.capturedStart(2) > pos) {
                    pos = match.capturedStart(2);
                    found = true;
                    break;
                }
                if (match.hasCaptured(3)) {
                    n = match.captured(3);
                    if (!n.endsWith(QLatin1Char(';')) && n == split[i] && match.capturedStart(3) > pos) {
                        pos = match.capturedStart(3);
                        found = true;
                        break;
                    }
                }
            }
            if (!found) {
                valid = false;
                break;
            }
        }

        if (valid) {
            QRegularExpression macro(QStringLiteral("enum +([A-Za-z0-9_]*)"));
            QRegularExpressionMatchIterator m = macro.globalMatch(data);
            while (m.hasNext()) {
                QRegularExpressionMatch match = m.next();

                if (match.capturedStart() < pos)
                    continue;

                QString n = match.captured(1);

                if (n == enumName) {
                    DEBUGPRINTF(printf("Found enum: %s\n", qPrintable(n)));
                    int begin = data.indexOf(QLatin1Char('{'), match.capturedEnd());
                    int end = data.indexOf(QLatin1Char('}'), begin);
                    QString block = data.mid(begin + 1, end - begin - 1);
                    const QStringList enums = block.split(QLatin1Char('\n'));
                    for (const auto &e : enums) {
                        const auto trimmed = e.trimmed();
                        if (!trimmed.isEmpty() && !trimmed.startsWith(QLatin1Char('#')))
                            ret << trimmed;
                    }

                    return ret;
                }
            }
        }
    }
    return ret;
}